

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array.cpp
# Opt level: O0

ON_UUID * __thiscall ON_UuidList::SearchHelper(ON_UuidList *this,ON_UUID *uuid)

{
  int iVar1;
  ON_UUID *local_38;
  int local_24;
  int i;
  ON_UUID *p;
  ON_UUID *uuid_local;
  ON_UuidList *this_local;
  
  if ((8 < (this->super_ON_SimpleArray<ON_UUID_struct>).m_count - this->m_sorted_count) ||
     (0 < this->m_removed_count)) {
    SortHelper(this);
  }
  if (this->m_sorted_count < 1) {
    local_38 = (ON_UUID *)0x0;
  }
  else {
    local_38 = (ON_UUID *)
               bsearch(uuid,(this->super_ON_SimpleArray<ON_UUID_struct>).m_a,
                       (long)this->m_sorted_count,0x10,CompareUuid);
  }
  if (local_38 == (ON_UUID *)0x0) {
    for (local_24 = this->m_sorted_count;
        local_24 < (this->super_ON_SimpleArray<ON_UUID_struct>).m_count; local_24 = local_24 + 1) {
      iVar1 = CompareUuid(uuid,(this->super_ON_SimpleArray<ON_UUID_struct>).m_a + local_24);
      if (iVar1 == 0) {
        return (this->super_ON_SimpleArray<ON_UUID_struct>).m_a + local_24;
      }
    }
  }
  return local_38;
}

Assistant:

ON_UUID* ON_UuidList::SearchHelper(const ON_UUID* uuid) const
{
  if ( m_count - m_sorted_count > 8 || m_removed_count > 0 )
  {
    // time to resort the array so that the speedy
    // bsearch() can be used to find uuids
    const_cast<ON_UuidList*>(this)->SortHelper();
  }

  ON_UUID* p = (m_sorted_count > 0 )
             ? (ON_UUID*)bsearch( uuid, m_a, m_sorted_count, sizeof(m_a[0]), 
                                  (int(*)(const void*,const void*))ON_UuidList::CompareUuid ) 
             : 0;

  if (0 == p)
  {
    // do a slow search on the last m_count-m_sort_count elements
    // in the array.
    int i;
    for ( i = m_sorted_count; i < m_count; i++ )
    {
      if ( 0 == ON_UuidList::CompareUuid(uuid,m_a+i) )
      {
        p = m_a+i;
        break;
      }
    }
  }

  return p;
}